

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateTestCaseUtil.hpp
# Opt level: O1

TestInstance * __thiscall
vkt::DynamicState::
InstanceFactory<vkt::DynamicState::(anonymous_namespace)::ScissorParamTestInstance>::createInstance
          (InstanceFactory<vkt::DynamicState::(anonymous_namespace)::ScissorParamTestInstance> *this
          ,Context *context)

{
  char *vertexShaderName;
  DynamicStateBaseClass *this_00;
  mapped_type *ppcVar1;
  key_type local_50 [2];
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_48;
  
  this_00 = (DynamicStateBaseClass *)operator_new(0x1a8);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree(&local_48,&(this->m_shaderPaths)._M_t);
  local_50[1] = 0;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_48,local_50 + 1);
  vertexShaderName = *ppcVar1;
  local_50[0] = SHADERTYPE_FRAGMENT;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_48,local_50);
  DynamicStateBaseClass::DynamicStateBaseClass(this_00,context,vertexShaderName,*ppcVar1);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__DynamicStateBaseClass_00d29370;
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__DynamicStateBaseClass_00d29410;
  anon_unknown_4::ViewportStateBaseCase::initialize((ViewportStateBaseCase *)this_00);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::~_Rb_tree(&local_48);
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* createInstance (Context& context) const
	{
		return new Instance(context, m_shaderPaths);
	}